

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::ComplexOptionType2::Clear(ComplexOptionType2 *this)

{
  uint uVar1;
  ComplexOptionType1 *this_00;
  ComplexOptionType2_ComplexOptionType4 *this_01;
  char *pcVar2;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ComplexOptionType2_ComplexOptionType4>>
            (&(this->field_0)._impl_.barney_.super_RepeatedPtrFieldBase);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = (this->field_0)._impl_.bar_;
      if (this_00 == (ComplexOptionType1 *)0x0) {
        pcVar2 = "from._impl_.bar_ != nullptr";
        line = 0x1020;
        goto LAB_00cf5aab;
      }
      ComplexOptionType1::Clear(this_00);
    }
    if ((uVar1 & 2) != 0) {
      this_01 = (this->field_0)._impl_.fred_;
      if (this_01 == (ComplexOptionType2_ComplexOptionType4 *)0x0) {
        pcVar2 = "from._impl_.fred_ != nullptr";
        line = 0x1024;
LAB_00cf5aab:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_custom_options.pb.cc"
                   ,line,pcVar2 + 5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      ComplexOptionType2_ComplexOptionType4::Clear(this_01);
    }
  }
  (this->field_0)._impl_.baz_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ComplexOptionType2::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.ComplexOptionType2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.barney_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.bar_ != nullptr);
      _impl_.bar_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.fred_ != nullptr);
      _impl_.fred_->Clear();
    }
  }
  _impl_.baz_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}